

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# protostream_objectsource.cc
# Opt level: O1

Status * __thiscall
google::protobuf::util::converter::ProtoStreamObjectSource::RenderFieldMask
          (Status *__return_storage_ptr__,ProtoStreamObjectSource *this,ProtoStreamObjectSource *os,
          Type *type,StringPiece field_name,ObjectWriter *ow)

{
  byte bVar1;
  CodedInputStream *pCVar2;
  byte *pbVar3;
  size_type *psVar4;
  _Alloc_hider _Var5;
  uint size;
  int iVar6;
  Field *pFVar7;
  int64 iVar8;
  undefined8 uVar9;
  ConverterCallback *pCVar10;
  uint32 uVar11;
  uint32 uVar12;
  StringPiece path;
  StringPiece error_message;
  string local_d8;
  Type *local_b8;
  ConverterCallback *local_b0;
  long *local_a8;
  Type *local_a0;
  code *local_98;
  undefined8 uStack_90;
  code *local_88;
  code *pcStack_80;
  size_type *local_78;
  string combined;
  string str;
  
  local_a8 = (long *)field_name.length_;
  pCVar10 = (ConverterCallback *)field_name.ptr_;
  local_78 = &combined._M_string_length;
  combined._M_dataplus._M_p = (pointer)0x0;
  combined._M_string_length._0_1_ = 0;
  pCVar2 = this->stream_;
  pbVar3 = pCVar2->buffer_;
  local_b8 = (Type *)os;
  local_b0 = pCVar10;
  local_a0 = type;
  str.field_2._8_8_ = __return_storage_ptr__;
  if (pbVar3 < pCVar2->buffer_end_) {
    uVar11 = (uint32)*pbVar3;
    if (-1 < (char)*pbVar3) {
      pCVar2->buffer_ = pbVar3 + 1;
      uVar9 = __return_storage_ptr__;
      goto LAB_00323d17;
    }
  }
  else {
    uVar11 = 0;
  }
  uVar9 = pCVar2;
  uVar11 = io::CodedInputStream::ReadTagFallback(pCVar2,uVar11);
LAB_00323d17:
  pCVar2->last_tag_ = uVar11;
  if (uVar11 != 0) {
    uVar12 = 0;
    do {
      if (uVar12 == 0) {
        pFVar7 = FindAndVerifyField((ProtoStreamObjectSource *)uVar9,local_b8,uVar11);
        uVar12 = 0;
        if ((pFVar7 != (Field *)0x0) && (uVar12 = 0, pFVar7->number_ == 1)) {
          iVar6 = std::__cxx11::string::compare((char *)(pFVar7->name_).ptr_);
          uVar12 = 0;
          if (iVar6 == 0) {
            uVar12 = uVar11;
          }
        }
      }
      uVar9 = str.field_2._8_8_;
      if (uVar12 != uVar11) {
        error_message.length_ = 0x24;
        error_message.ptr_ = "Invalid FieldMask, unexpected field.";
        Status::Status((Status *)str.field_2._8_8_,INTERNAL,error_message);
        goto LAB_00323f37;
      }
      combined.field_2._8_8_ = &str._M_string_length;
      str._M_dataplus._M_p = (pointer)0x0;
      str._M_string_length._0_1_ = 0;
      pCVar2 = this->stream_;
      pbVar3 = pCVar2->buffer_;
      if (pbVar3 < pCVar2->buffer_end_) {
        bVar1 = *pbVar3;
        size = (uint)bVar1;
        uVar11 = (uint32)bVar1;
        if ((char)bVar1 < '\0') goto LAB_00323da9;
        pCVar2->buffer_ = pbVar3 + 1;
      }
      else {
        uVar11 = 0;
LAB_00323da9:
        iVar8 = io::CodedInputStream::ReadVarint32Fallback(pCVar2,uVar11);
        size = (uint)iVar8;
      }
      io::CodedInputStream::ReadString(this->stream_,(string *)((long)&combined.field_2 + 8),size);
      if (combined._M_dataplus._M_p != (pointer)0x0) {
        std::__cxx11::string::append((char *)&local_78);
      }
      _Var5._M_p = str._M_dataplus._M_p;
      uVar9 = combined.field_2._8_8_;
      if ((long)str._M_dataplus._M_p < 0) {
        StringPiece::LogFatalSizeTooBig((size_t)str._M_dataplus._M_p,"size_t to int conversion");
      }
      uStack_90 = 0;
      local_98 = ToCamelCase_abi_cxx11_;
      pcStack_80 = std::
                   _Function_handler<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_(google::protobuf::StringPiece),_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_(*)(google::protobuf::StringPiece)>
                   ::_M_invoke;
      local_88 = std::
                 _Function_handler<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_(google::protobuf::StringPiece),_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_(*)(google::protobuf::StringPiece)>
                 ::_M_manager;
      path.length_ = (stringpiece_ssize_type)&local_98;
      path.ptr_ = _Var5._M_p;
      ConvertFieldMaskPath(&local_d8,(converter *)uVar9,path,pCVar10);
      std::__cxx11::string::_M_append((char *)&local_78,(ulong)local_d8._M_dataplus._M_p);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_d8._M_dataplus._M_p != &local_d8.field_2) {
        operator_delete(local_d8._M_dataplus._M_p);
      }
      if (local_88 != (code *)0x0) {
        (*local_88)(&local_98,&local_98,3);
      }
      uVar9 = combined.field_2._8_8_;
      if ((size_type *)combined.field_2._8_8_ != &str._M_string_length) {
        operator_delete((void *)combined.field_2._8_8_);
      }
      pCVar2 = this->stream_;
      pbVar3 = pCVar2->buffer_;
      if (pbVar3 < pCVar2->buffer_end_) {
        uVar11 = (uint32)*pbVar3;
        if ((char)*pbVar3 < '\0') goto LAB_00323eb1;
        pCVar2->buffer_ = pbVar3 + 1;
      }
      else {
        uVar11 = 0;
LAB_00323eb1:
        uVar9 = pCVar2;
        uVar11 = io::CodedInputStream::ReadTagFallback(pCVar2,uVar11);
      }
      pCVar2->last_tag_ = uVar11;
    } while (uVar11 != 0);
  }
  uVar9 = str.field_2._8_8_;
  _Var5._M_p = combined._M_dataplus._M_p;
  psVar4 = local_78;
  pCVar10 = local_b0;
  if ((long)combined._M_dataplus._M_p < 0) {
    StringPiece::LogFatalSizeTooBig((size_t)combined._M_dataplus._M_p,"size_t to int conversion");
  }
  (**(code **)(*local_a8 + 0x68))(local_a8,local_a0,pCVar10,psVar4,_Var5._M_p);
  Status::Status((Status *)uVar9);
LAB_00323f37:
  if (local_78 != &combined._M_string_length) {
    operator_delete(local_78);
  }
  return (Status *)uVar9;
}

Assistant:

Status ProtoStreamObjectSource::RenderFieldMask(
    const ProtoStreamObjectSource* os, const google::protobuf::Type& type,
    StringPiece field_name, ObjectWriter* ow) {
  std::string combined;
  uint32 buffer32;
  uint32 paths_field_tag = 0;
  for (uint32 tag = os->stream_->ReadTag(); tag != 0;
       tag = os->stream_->ReadTag()) {
    if (paths_field_tag == 0) {
      const google::protobuf::Field* field = os->FindAndVerifyField(type, tag);
      if (field != nullptr && field->number() == 1 &&
          field->name() == "paths") {
        paths_field_tag = tag;
      }
    }
    if (paths_field_tag != tag) {
      return util::Status(util::error::INTERNAL,
                          "Invalid FieldMask, unexpected field.");
    }
    std::string str;
    os->stream_->ReadVarint32(&buffer32);  // string size.
    os->stream_->ReadString(&str, buffer32);
    if (!combined.empty()) {
      combined.append(",");
    }
    combined.append(ConvertFieldMaskPath(str, &ToCamelCase));
  }
  ow->RenderString(field_name, combined);
  return util::Status();
}